

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O1

void Fx_ManCreateLiterals(Fx_Man_t *p,int nVars)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Wec_t *pVVar6;
  void *pvVar7;
  Vec_Int_t *pVVar8;
  int **ppiVar9;
  long lVar10;
  int iVar11;
  size_t __size;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  
  p->nVars = 0;
  p->nLits = 0;
  pVVar6 = p->vCubes;
  iVar3 = pVVar6->nSize;
  if (0 < (long)iVar3) {
    pVVar4 = pVVar6->pArray;
    lVar10 = 0;
    do {
      uVar1 = pVVar4[lVar10].nSize;
      if ((int)uVar1 < 1) {
        __assert_fail("Vec_IntSize(vCube) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                      ,0x2d0,"void Fx_ManCreateLiterals(Fx_Man_t *, int)");
      }
      piVar5 = pVVar4[lVar10].pArray;
      iVar11 = *piVar5;
      if (iVar11 < p->nVars) {
        iVar11 = p->nVars;
      }
      p->nVars = iVar11;
      p->nLits = uVar1 + p->nLits + -1;
      if ((ulong)uVar1 != 1) {
        uVar13 = 1;
        do {
          uVar14 = piVar5[uVar13];
          if ((int)uVar14 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar14 = uVar14 >> 1;
          if ((int)uVar14 < p->nVars) {
            uVar14 = p->nVars;
          }
          p->nVars = uVar14;
          uVar13 = uVar13 + 1;
        } while (uVar1 != uVar13);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar3);
  }
  if (nVars <= p->nVars) {
    __assert_fail("p->nVars < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                  ,0x2d7,"void Fx_ManCreateLiterals(Fx_Man_t *, int)");
  }
  p->nVars = nVars;
  iVar3 = nVars * 2;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  uVar1 = nVars * 2 - 1;
  iVar11 = 0x10;
  if (0xe < uVar1) {
    iVar11 = iVar3;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar11;
  if (iVar11 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar11 << 2);
  }
  pVVar4->pArray = piVar5;
  pVVar4->nSize = iVar3;
  if (piVar5 != (int *)0x0) {
    memset(piVar5,0,(long)iVar3 << 2);
  }
  p->vCounts = pVVar4;
  if (0 < pVVar6->nSize) {
    pVVar8 = pVVar6->pArray;
    lVar10 = 0;
    do {
      if (1 < pVVar8[lVar10].nSize) {
        piVar2 = pVVar8[lVar10].pArray;
        lVar12 = 1;
        do {
          iVar11 = piVar2[lVar12];
          if (((long)iVar11 < 0) || (pVVar4->nSize <= iVar11)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          piVar5[iVar11] = piVar5[iVar11] + 1;
          lVar12 = lVar12 + 1;
        } while (lVar12 < pVVar8[lVar10].nSize);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar6->nSize);
  }
  pVVar6 = (Vec_Wec_t *)malloc(0x10);
  iVar11 = 8;
  if (6 < uVar1) {
    iVar11 = iVar3;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar11;
  if (iVar11 == 0) {
    pVVar4 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar4 = (Vec_Int_t *)calloc((long)iVar11,0x10);
  }
  pVVar6->pArray = pVVar4;
  pVVar6->nSize = iVar3;
  p->vLits = pVVar6;
  pVVar4 = p->vCounts;
  if (0 < pVVar4->nSize) {
    lVar10 = 8;
    lVar12 = 0;
    do {
      if (p->vLits->nSize <= lVar12) {
LAB_002ca2a4:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      iVar3 = pVVar4->pArray[lVar12];
      pVVar4 = p->vLits->pArray;
      if (*(int *)((long)pVVar4 + lVar10 + -8) < iVar3) {
        pvVar7 = *(void **)((long)&pVVar4->nCap + lVar10);
        if (pvVar7 == (void *)0x0) {
          pvVar7 = malloc((long)iVar3 << 2);
        }
        else {
          pvVar7 = realloc(pvVar7,(long)iVar3 << 2);
        }
        *(void **)((long)&pVVar4->nCap + lVar10) = pvVar7;
        if (pvVar7 == (void *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        *(int *)((long)pVVar4 + lVar10 + -8) = iVar3;
      }
      lVar12 = lVar12 + 1;
      pVVar4 = p->vCounts;
      lVar10 = lVar10 + 0x10;
    } while (lVar12 < pVVar4->nSize);
  }
  pVVar6 = p->vCubes;
  if (0 < pVVar6->nSize) {
    lVar10 = 0;
    do {
      pVVar4 = pVVar6->pArray;
      if (1 < pVVar4[lVar10].nSize) {
        lVar12 = 1;
        do {
          uVar1 = pVVar4[lVar10].pArray[lVar12];
          pVVar6 = p->vLits;
          if (pVVar6->nSize <= (int)uVar1) {
            iVar11 = uVar1 + 1;
            iVar3 = pVVar6->nSize * 2;
            if (iVar3 <= iVar11) {
              iVar3 = iVar11;
            }
            if (pVVar6->nCap < iVar3) {
              __size = (long)iVar3 << 4;
              if (pVVar6->pArray == (Vec_Int_t *)0x0) {
                pVVar8 = (Vec_Int_t *)malloc(__size);
              }
              else {
                pVVar8 = (Vec_Int_t *)realloc(pVVar6->pArray,__size);
              }
              pVVar6->pArray = pVVar8;
              memset(pVVar8 + pVVar6->nCap,0,((long)iVar3 - (long)pVVar6->nCap) * 0x10);
              pVVar6->nCap = iVar3;
            }
            pVVar6->nSize = iVar11;
          }
          if (((int)uVar1 < 0) || (pVVar6->nSize <= (int)uVar1)) goto LAB_002ca2a4;
          Vec_IntPush(pVVar6->pArray + uVar1,(int)lVar10);
          lVar12 = lVar12 + 1;
        } while (lVar12 < pVVar4[lVar10].nSize);
      }
      lVar10 = lVar10 + 1;
      pVVar6 = p->vCubes;
    } while (lVar10 < pVVar6->nSize);
  }
  iVar3 = p->nVars;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar11 = iVar3;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar11;
  if (iVar11 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar11 << 2);
  }
  pVVar4->pArray = piVar5;
  pVVar4->nSize = iVar3;
  if (piVar5 != (int *)0x0) {
    memset(piVar5,0xff,(long)iVar3 << 2);
  }
  p->vVarCube = pVVar4;
  if (0 < pVVar6->nSize) {
    ppiVar9 = &pVVar6->pArray->pArray;
    lVar10 = 0;
    do {
      if (*(int *)((long)ppiVar9 + -4) < 1) {
LAB_002ca301:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      lVar12 = (long)**ppiVar9;
      if ((lVar12 < 0) || (pVVar4->nSize <= **ppiVar9)) goto LAB_002ca301;
      if (piVar5[lVar12] == -1) {
        piVar5[lVar12] = (int)lVar10;
      }
      lVar10 = lVar10 + 1;
      ppiVar9 = ppiVar9 + 2;
    } while (lVar10 < pVVar6->nSize);
  }
  return;
}

Assistant:

void Fx_ManCreateLiterals( Fx_Man_t * p, int nVars )
{
    Vec_Int_t * vCube;
    int i, k, Lit, Count;
    // find the number of variables
    p->nVars = p->nLits = 0;
    Vec_WecForEachLevel( p->vCubes, vCube, i )
    {
        assert( Vec_IntSize(vCube) > 0 );
        p->nVars = Abc_MaxInt( p->nVars, Vec_IntEntry(vCube, 0) );
        p->nLits += Vec_IntSize(vCube) - 1;
        Vec_IntForEachEntryStart( vCube, Lit, k, 1 )
            p->nVars = Abc_MaxInt( p->nVars, Abc_Lit2Var(Lit) );
    }
//    p->nVars++;
    assert( p->nVars < nVars );
    p->nVars = nVars;
    // count literals
    p->vCounts = Vec_IntStart( 2*p->nVars );
    Vec_WecForEachLevel( p->vCubes, vCube, i )
        Vec_IntForEachEntryStart( vCube, Lit, k, 1 )
            Vec_IntAddToEntry( p->vCounts, Lit, 1 );
    // start literals
    p->vLits = Vec_WecStart( 2*p->nVars );
    Vec_IntForEachEntry( p->vCounts, Count, Lit )
        Vec_IntGrow( Vec_WecEntry(p->vLits, Lit), Count );
    // fill out literals
    Vec_WecForEachLevel( p->vCubes, vCube, i )
        Vec_IntForEachEntryStart( vCube, Lit, k, 1 )
            Vec_WecPush( p->vLits, Lit, i );
    // create mapping of variable into the first cube
    p->vVarCube = Vec_IntStartFull( p->nVars );
    Vec_WecForEachLevel( p->vCubes, vCube, i )
        if ( Vec_IntEntry(p->vVarCube, Vec_IntEntry(vCube, 0)) == -1 )
            Vec_IntWriteEntry( p->vVarCube, Vec_IntEntry(vCube, 0), i );
}